

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_2dcf93::Db::parseUnqualifiedName(Db *this,NameState *State)

{
  short *psVar1;
  bool bVar2;
  short *psVar3;
  short *psVar4;
  Node **ppNVar5;
  Node **ppNVar6;
  char *pcVar7;
  Node *pNVar8;
  undefined **ppuVar9;
  NameState *pNVar10;
  NodeArray NVar11;
  Node NVar12;
  Node *local_40;
  size_t local_38;
  
  psVar3 = (short *)this->First;
  psVar4 = (short *)this->Last;
  if (psVar4 == psVar3) {
LAB_0018bccd:
    if ((1 < (ulong)((long)psVar4 - (long)psVar3)) && (*psVar3 == 0x4344)) {
      this->First = (char *)(psVar3 + 1);
      ppNVar5 = (this->Names).Last;
      ppNVar6 = (this->Names).First;
      local_40 = parseSourceName(this,State);
      if (local_40 == (Node *)0x0) {
        return (Node *)0x0;
      }
      while( true ) {
        pNVar10 = (NameState *)&local_40;
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
        pcVar7 = this->First;
        if ((pcVar7 != this->Last) && (*pcVar7 == 'E')) break;
        local_40 = parseSourceName(this,pNVar10);
        if (local_40 == (Node *)0x0) {
          return (Node *)0x0;
        }
      }
      this->First = pcVar7 + 1;
      NVar12 = (Node)popTrailingNodeArray(this,(long)ppNVar5 - (long)ppNVar6 >> 3);
      pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar8->K = KStructuredBindingName;
      pNVar8->RHSComponentCache = No;
      pNVar8->ArrayCache = No;
      pNVar8->FunctionCache = No;
      ppuVar9 = &PTR_hasRHSComponentSlow_001d04b0;
LAB_0018bdff:
      pNVar8->_vptr_Node = (_func_int **)ppuVar9;
      pNVar8[1] = NVar12;
      goto LAB_0018bcee;
    }
    pNVar8 = parseOperatorName(this,State);
  }
  else if ((char)*psVar3 == 'U') {
    if ((ulong)((long)psVar4 - (long)psVar3) < 2) {
      return (Node *)0x0;
    }
    if (*psVar3 == 0x7455) {
      this->First = (char *)(psVar3 + 1);
      NVar12 = (Node)parseNumber(this,false);
      pcVar7 = this->First;
      if (pcVar7 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar7 != '_') {
        return (Node *)0x0;
      }
      this->First = pcVar7 + 1;
      pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar8->K = KUnnamedTypeName;
      pNVar8->RHSComponentCache = No;
      pNVar8->ArrayCache = No;
      pNVar8->FunctionCache = No;
      ppuVar9 = &PTR_hasRHSComponentSlow_001d0400;
      goto LAB_0018bdff;
    }
    if (*psVar3 != 0x6c55) {
      return (Node *)0x0;
    }
    psVar1 = psVar3 + 1;
    this->First = (char *)psVar1;
    bVar2 = this->ParsingLambdaParams;
    this->ParsingLambdaParams = true;
    if (((ulong)((long)psVar4 - (long)psVar1) < 2) || (*psVar1 != 0x4576)) {
      ppNVar5 = (this->Names).Last;
      ppNVar6 = (this->Names).First;
      local_40 = parseType(this);
      if (local_40 != (Node *)0x0) {
        do {
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
          pcVar7 = this->First;
          if ((pcVar7 != this->Last) && (*pcVar7 == 'E')) {
            this->First = pcVar7 + 1;
            NVar11 = popTrailingNodeArray(this,(long)ppNVar5 - (long)ppNVar6 >> 3);
            goto LAB_0018be3d;
          }
          local_40 = parseType(this);
        } while (local_40 != (Node *)0x0);
      }
LAB_0018bea0:
      pNVar8 = (Node *)0x0;
    }
    else {
      this->First = (char *)(psVar3 + 2);
      NVar11 = (NodeArray)ZEXT816(0);
LAB_0018be3d:
      local_38 = NVar11.NumElements;
      pNVar8 = (Node *)0x0;
      NVar12 = (Node)parseNumber(this,false);
      pcVar7 = this->First;
      if (pcVar7 != this->Last) {
        if (*pcVar7 != '_') goto LAB_0018bea0;
        this->First = pcVar7 + 1;
        pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
        pNVar8->K = KClosureTypeName;
        pNVar8->RHSComponentCache = No;
        pNVar8->ArrayCache = No;
        pNVar8->FunctionCache = No;
        pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d0458;
        pNVar8[1]._vptr_Node = (_func_int **)NVar11.Elements;
        pNVar8[1].K = (undefined1)local_38;
        pNVar8[1].RHSComponentCache = local_38._1_1_;
        pNVar8[1].ArrayCache = local_38._2_1_;
        pNVar8[1].FunctionCache = local_38._3_1_;
        *(undefined4 *)&pNVar8[1].field_0xc = local_38._4_4_;
        pNVar8[2] = NVar12;
      }
    }
    this->ParsingLambdaParams = bVar2;
  }
  else {
    if (8 < (byte)((char)*psVar3 - 0x31U)) goto LAB_0018bccd;
    pNVar8 = parseSourceName(this,State);
  }
  if (pNVar8 == (Node *)0x0) {
    return (Node *)0x0;
  }
LAB_0018bcee:
  pNVar8 = parseAbiTags(this,pNVar8);
  return pNVar8;
}

Assistant:

Node *Db::parseUnqualifiedName(NameState *State) {
 // <ctor-dtor-name>s are special-cased in parseNestedName().
 Node *Result;
 if (look() == 'U')
   Result = parseUnnamedTypeName(State);
 else if (look() >= '1' && look() <= '9')
   Result = parseSourceName(State);
 else if (consumeIf("DC")) {
   size_t BindingsBegin = Names.size();
   do {
     Node *Binding = parseSourceName(State);
     if (Binding == nullptr)
       return nullptr;
     Names.push_back(Binding);
   } while (!consumeIf('E'));
   Result = make<StructuredBindingName>(popTrailingNodeArray(BindingsBegin));
 } else
   Result = parseOperatorName(State);
 if (Result != nullptr)
   Result = parseAbiTags(Result);
 return Result;
}